

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dj_algebra.h
# Opt level: O0

mat4 * dja::adjugate(mat4 *__return_storage_ptr__,mat4 *m)

{
  float fVar1;
  float fVar2;
  float fVar3;
  vec4 *pvVar4;
  float_t *pfVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float_t c0;
  float_t c1;
  float_t c2;
  float_t c3;
  float_t c4;
  float_t c5;
  float_t s5;
  float_t s4;
  float_t s3;
  float_t s2;
  float_t s1;
  float_t s0;
  mat4 *m_local;
  
  pvVar4 = mat4::operator[](m,0);
  pfVar5 = vec4::operator[](pvVar4,0);
  fVar1 = *pfVar5;
  pvVar4 = mat4::operator[](m,1);
  pfVar5 = vec4::operator[](pvVar4,1);
  fVar2 = *pfVar5;
  pvVar4 = mat4::operator[](m,1);
  pfVar5 = vec4::operator[](pvVar4,0);
  fVar3 = *pfVar5;
  pvVar4 = mat4::operator[](m,0);
  pfVar5 = vec4::operator[](pvVar4,1);
  fVar6 = fVar1 * fVar2 + -(fVar3 * *pfVar5);
  pvVar4 = mat4::operator[](m,0);
  pfVar5 = vec4::operator[](pvVar4,0);
  fVar1 = *pfVar5;
  pvVar4 = mat4::operator[](m,1);
  pfVar5 = vec4::operator[](pvVar4,2);
  fVar2 = *pfVar5;
  pvVar4 = mat4::operator[](m,1);
  pfVar5 = vec4::operator[](pvVar4,0);
  fVar3 = *pfVar5;
  pvVar4 = mat4::operator[](m,0);
  pfVar5 = vec4::operator[](pvVar4,2);
  fVar7 = fVar1 * fVar2 + -(fVar3 * *pfVar5);
  pvVar4 = mat4::operator[](m,0);
  pfVar5 = vec4::operator[](pvVar4,0);
  fVar1 = *pfVar5;
  pvVar4 = mat4::operator[](m,1);
  pfVar5 = vec4::operator[](pvVar4,3);
  fVar2 = *pfVar5;
  pvVar4 = mat4::operator[](m,1);
  pfVar5 = vec4::operator[](pvVar4,0);
  fVar3 = *pfVar5;
  pvVar4 = mat4::operator[](m,0);
  pfVar5 = vec4::operator[](pvVar4,3);
  fVar8 = fVar1 * fVar2 + -(fVar3 * *pfVar5);
  pvVar4 = mat4::operator[](m,0);
  pfVar5 = vec4::operator[](pvVar4,1);
  fVar1 = *pfVar5;
  pvVar4 = mat4::operator[](m,1);
  pfVar5 = vec4::operator[](pvVar4,2);
  fVar2 = *pfVar5;
  pvVar4 = mat4::operator[](m,1);
  pfVar5 = vec4::operator[](pvVar4,1);
  fVar3 = *pfVar5;
  pvVar4 = mat4::operator[](m,0);
  pfVar5 = vec4::operator[](pvVar4,2);
  fVar9 = fVar1 * fVar2 + -(fVar3 * *pfVar5);
  pvVar4 = mat4::operator[](m,0);
  pfVar5 = vec4::operator[](pvVar4,1);
  fVar1 = *pfVar5;
  pvVar4 = mat4::operator[](m,1);
  pfVar5 = vec4::operator[](pvVar4,3);
  fVar2 = *pfVar5;
  pvVar4 = mat4::operator[](m,1);
  pfVar5 = vec4::operator[](pvVar4,1);
  fVar3 = *pfVar5;
  pvVar4 = mat4::operator[](m,0);
  pfVar5 = vec4::operator[](pvVar4,3);
  fVar10 = fVar1 * fVar2 + -(fVar3 * *pfVar5);
  pvVar4 = mat4::operator[](m,0);
  pfVar5 = vec4::operator[](pvVar4,2);
  fVar1 = *pfVar5;
  pvVar4 = mat4::operator[](m,1);
  pfVar5 = vec4::operator[](pvVar4,3);
  fVar2 = *pfVar5;
  pvVar4 = mat4::operator[](m,1);
  pfVar5 = vec4::operator[](pvVar4,2);
  fVar3 = *pfVar5;
  pvVar4 = mat4::operator[](m,0);
  pfVar5 = vec4::operator[](pvVar4,3);
  fVar11 = fVar1 * fVar2 + -(fVar3 * *pfVar5);
  pvVar4 = mat4::operator[](m,2);
  pfVar5 = vec4::operator[](pvVar4,2);
  fVar1 = *pfVar5;
  pvVar4 = mat4::operator[](m,3);
  pfVar5 = vec4::operator[](pvVar4,3);
  fVar2 = *pfVar5;
  pvVar4 = mat4::operator[](m,3);
  pfVar5 = vec4::operator[](pvVar4,2);
  fVar3 = *pfVar5;
  pvVar4 = mat4::operator[](m,2);
  pfVar5 = vec4::operator[](pvVar4,3);
  fVar12 = fVar1 * fVar2 + -(fVar3 * *pfVar5);
  pvVar4 = mat4::operator[](m,2);
  pfVar5 = vec4::operator[](pvVar4,1);
  fVar1 = *pfVar5;
  pvVar4 = mat4::operator[](m,3);
  pfVar5 = vec4::operator[](pvVar4,3);
  fVar2 = *pfVar5;
  pvVar4 = mat4::operator[](m,3);
  pfVar5 = vec4::operator[](pvVar4,1);
  fVar3 = *pfVar5;
  pvVar4 = mat4::operator[](m,2);
  pfVar5 = vec4::operator[](pvVar4,3);
  fVar13 = fVar1 * fVar2 + -(fVar3 * *pfVar5);
  pvVar4 = mat4::operator[](m,2);
  pfVar5 = vec4::operator[](pvVar4,1);
  fVar1 = *pfVar5;
  pvVar4 = mat4::operator[](m,3);
  pfVar5 = vec4::operator[](pvVar4,2);
  fVar2 = *pfVar5;
  pvVar4 = mat4::operator[](m,3);
  pfVar5 = vec4::operator[](pvVar4,1);
  fVar3 = *pfVar5;
  pvVar4 = mat4::operator[](m,2);
  pfVar5 = vec4::operator[](pvVar4,2);
  fVar14 = fVar1 * fVar2 + -(fVar3 * *pfVar5);
  pvVar4 = mat4::operator[](m,2);
  pfVar5 = vec4::operator[](pvVar4,0);
  fVar1 = *pfVar5;
  pvVar4 = mat4::operator[](m,3);
  pfVar5 = vec4::operator[](pvVar4,3);
  fVar2 = *pfVar5;
  pvVar4 = mat4::operator[](m,3);
  pfVar5 = vec4::operator[](pvVar4,0);
  fVar3 = *pfVar5;
  pvVar4 = mat4::operator[](m,2);
  pfVar5 = vec4::operator[](pvVar4,3);
  fVar15 = fVar1 * fVar2 + -(fVar3 * *pfVar5);
  pvVar4 = mat4::operator[](m,2);
  pfVar5 = vec4::operator[](pvVar4,0);
  fVar1 = *pfVar5;
  pvVar4 = mat4::operator[](m,3);
  pfVar5 = vec4::operator[](pvVar4,2);
  fVar2 = *pfVar5;
  pvVar4 = mat4::operator[](m,3);
  pfVar5 = vec4::operator[](pvVar4,0);
  fVar3 = *pfVar5;
  pvVar4 = mat4::operator[](m,2);
  pfVar5 = vec4::operator[](pvVar4,2);
  fVar16 = fVar1 * fVar2 + -(fVar3 * *pfVar5);
  pvVar4 = mat4::operator[](m,2);
  pfVar5 = vec4::operator[](pvVar4,0);
  fVar1 = *pfVar5;
  pvVar4 = mat4::operator[](m,3);
  pfVar5 = vec4::operator[](pvVar4,1);
  fVar2 = *pfVar5;
  pvVar4 = mat4::operator[](m,3);
  pfVar5 = vec4::operator[](pvVar4,0);
  fVar3 = *pfVar5;
  pvVar4 = mat4::operator[](m,2);
  pfVar5 = vec4::operator[](pvVar4,1);
  fVar17 = fVar1 * fVar2 + -(fVar3 * *pfVar5);
  mat4::mat4(__return_storage_ptr__,1.0);
  pvVar4 = mat4::operator[](m,1);
  pfVar5 = vec4::operator[](pvVar4,1);
  fVar1 = *pfVar5;
  pvVar4 = mat4::operator[](m,1);
  pfVar5 = vec4::operator[](pvVar4,2);
  fVar2 = *pfVar5;
  pvVar4 = mat4::operator[](m,1);
  pfVar5 = vec4::operator[](pvVar4,3);
  fVar3 = *pfVar5;
  pvVar4 = mat4::operator[](__return_storage_ptr__,0);
  pfVar5 = vec4::operator[](pvVar4,0);
  *pfVar5 = fVar3 * fVar14 + fVar1 * fVar12 + -(fVar2 * fVar13);
  pvVar4 = mat4::operator[](m,0);
  pfVar5 = vec4::operator[](pvVar4,1);
  fVar1 = *pfVar5;
  pvVar4 = mat4::operator[](m,0);
  pfVar5 = vec4::operator[](pvVar4,2);
  fVar2 = *pfVar5;
  pvVar4 = mat4::operator[](m,0);
  pfVar5 = vec4::operator[](pvVar4,3);
  fVar3 = *pfVar5;
  pvVar4 = mat4::operator[](__return_storage_ptr__,0);
  pfVar5 = vec4::operator[](pvVar4,1);
  *pfVar5 = -fVar3 * fVar14 + -fVar1 * fVar12 + fVar2 * fVar13;
  pvVar4 = mat4::operator[](m,3);
  pfVar5 = vec4::operator[](pvVar4,1);
  fVar1 = *pfVar5;
  pvVar4 = mat4::operator[](m,3);
  pfVar5 = vec4::operator[](pvVar4,2);
  fVar2 = *pfVar5;
  pvVar4 = mat4::operator[](m,3);
  pfVar5 = vec4::operator[](pvVar4,3);
  fVar3 = *pfVar5;
  pvVar4 = mat4::operator[](__return_storage_ptr__,0);
  pfVar5 = vec4::operator[](pvVar4,2);
  *pfVar5 = fVar3 * fVar9 + fVar1 * fVar11 + -(fVar2 * fVar10);
  pvVar4 = mat4::operator[](m,2);
  pfVar5 = vec4::operator[](pvVar4,1);
  fVar1 = *pfVar5;
  pvVar4 = mat4::operator[](m,2);
  pfVar5 = vec4::operator[](pvVar4,2);
  fVar2 = *pfVar5;
  pvVar4 = mat4::operator[](m,2);
  pfVar5 = vec4::operator[](pvVar4,3);
  fVar3 = *pfVar5;
  pvVar4 = mat4::operator[](__return_storage_ptr__,0);
  pfVar5 = vec4::operator[](pvVar4,3);
  *pfVar5 = -fVar3 * fVar9 + -fVar1 * fVar11 + fVar2 * fVar10;
  pvVar4 = mat4::operator[](m,1);
  pfVar5 = vec4::operator[](pvVar4,0);
  fVar1 = *pfVar5;
  pvVar4 = mat4::operator[](m,1);
  pfVar5 = vec4::operator[](pvVar4,2);
  fVar2 = *pfVar5;
  pvVar4 = mat4::operator[](m,1);
  pfVar5 = vec4::operator[](pvVar4,3);
  fVar3 = *pfVar5;
  pvVar4 = mat4::operator[](__return_storage_ptr__,1);
  pfVar5 = vec4::operator[](pvVar4,0);
  *pfVar5 = -fVar3 * fVar16 + -fVar1 * fVar12 + fVar2 * fVar15;
  pvVar4 = mat4::operator[](m,0);
  pfVar5 = vec4::operator[](pvVar4,0);
  fVar1 = *pfVar5;
  pvVar4 = mat4::operator[](m,0);
  pfVar5 = vec4::operator[](pvVar4,2);
  fVar2 = *pfVar5;
  pvVar4 = mat4::operator[](m,0);
  pfVar5 = vec4::operator[](pvVar4,3);
  fVar3 = *pfVar5;
  pvVar4 = mat4::operator[](__return_storage_ptr__,1);
  pfVar5 = vec4::operator[](pvVar4,1);
  *pfVar5 = fVar3 * fVar16 + fVar1 * fVar12 + -(fVar2 * fVar15);
  pvVar4 = mat4::operator[](m,3);
  pfVar5 = vec4::operator[](pvVar4,0);
  fVar1 = *pfVar5;
  pvVar4 = mat4::operator[](m,3);
  pfVar5 = vec4::operator[](pvVar4,2);
  fVar2 = *pfVar5;
  pvVar4 = mat4::operator[](m,3);
  pfVar5 = vec4::operator[](pvVar4,3);
  fVar3 = *pfVar5;
  pvVar4 = mat4::operator[](__return_storage_ptr__,1);
  pfVar5 = vec4::operator[](pvVar4,2);
  *pfVar5 = -fVar3 * fVar7 + -fVar1 * fVar11 + fVar2 * fVar8;
  pvVar4 = mat4::operator[](m,2);
  pfVar5 = vec4::operator[](pvVar4,0);
  fVar1 = *pfVar5;
  pvVar4 = mat4::operator[](m,2);
  pfVar5 = vec4::operator[](pvVar4,2);
  fVar2 = *pfVar5;
  pvVar4 = mat4::operator[](m,2);
  pfVar5 = vec4::operator[](pvVar4,3);
  fVar3 = *pfVar5;
  pvVar4 = mat4::operator[](__return_storage_ptr__,1);
  pfVar5 = vec4::operator[](pvVar4,3);
  *pfVar5 = fVar3 * fVar7 + fVar1 * fVar11 + -(fVar2 * fVar8);
  pvVar4 = mat4::operator[](m,1);
  pfVar5 = vec4::operator[](pvVar4,0);
  fVar1 = *pfVar5;
  pvVar4 = mat4::operator[](m,1);
  pfVar5 = vec4::operator[](pvVar4,1);
  fVar2 = *pfVar5;
  pvVar4 = mat4::operator[](m,1);
  pfVar5 = vec4::operator[](pvVar4,3);
  fVar3 = *pfVar5;
  pvVar4 = mat4::operator[](__return_storage_ptr__,2);
  pfVar5 = vec4::operator[](pvVar4,0);
  *pfVar5 = fVar3 * fVar17 + fVar1 * fVar13 + -(fVar2 * fVar15);
  pvVar4 = mat4::operator[](m,0);
  pfVar5 = vec4::operator[](pvVar4,0);
  fVar1 = *pfVar5;
  pvVar4 = mat4::operator[](m,0);
  pfVar5 = vec4::operator[](pvVar4,1);
  fVar2 = *pfVar5;
  pvVar4 = mat4::operator[](m,0);
  pfVar5 = vec4::operator[](pvVar4,3);
  fVar3 = *pfVar5;
  pvVar4 = mat4::operator[](__return_storage_ptr__,2);
  pfVar5 = vec4::operator[](pvVar4,1);
  *pfVar5 = -fVar3 * fVar17 + -fVar1 * fVar13 + fVar2 * fVar15;
  pvVar4 = mat4::operator[](m,3);
  pfVar5 = vec4::operator[](pvVar4,0);
  fVar1 = *pfVar5;
  pvVar4 = mat4::operator[](m,3);
  pfVar5 = vec4::operator[](pvVar4,1);
  fVar2 = *pfVar5;
  pvVar4 = mat4::operator[](m,3);
  pfVar5 = vec4::operator[](pvVar4,3);
  fVar3 = *pfVar5;
  pvVar4 = mat4::operator[](__return_storage_ptr__,2);
  pfVar5 = vec4::operator[](pvVar4,2);
  *pfVar5 = fVar3 * fVar6 + fVar1 * fVar10 + -(fVar2 * fVar8);
  pvVar4 = mat4::operator[](m,2);
  pfVar5 = vec4::operator[](pvVar4,0);
  fVar1 = *pfVar5;
  pvVar4 = mat4::operator[](m,2);
  pfVar5 = vec4::operator[](pvVar4,1);
  fVar2 = *pfVar5;
  pvVar4 = mat4::operator[](m,2);
  pfVar5 = vec4::operator[](pvVar4,3);
  fVar3 = *pfVar5;
  pvVar4 = mat4::operator[](__return_storage_ptr__,2);
  pfVar5 = vec4::operator[](pvVar4,3);
  *pfVar5 = -fVar3 * fVar6 + -fVar1 * fVar10 + fVar2 * fVar8;
  pvVar4 = mat4::operator[](m,1);
  pfVar5 = vec4::operator[](pvVar4,0);
  fVar1 = *pfVar5;
  pvVar4 = mat4::operator[](m,1);
  pfVar5 = vec4::operator[](pvVar4,1);
  fVar2 = *pfVar5;
  pvVar4 = mat4::operator[](m,1);
  pfVar5 = vec4::operator[](pvVar4,2);
  fVar3 = *pfVar5;
  pvVar4 = mat4::operator[](__return_storage_ptr__,3);
  pfVar5 = vec4::operator[](pvVar4,0);
  *pfVar5 = -fVar3 * fVar17 + -fVar1 * fVar14 + fVar2 * fVar16;
  pvVar4 = mat4::operator[](m,0);
  pfVar5 = vec4::operator[](pvVar4,0);
  fVar1 = *pfVar5;
  pvVar4 = mat4::operator[](m,0);
  pfVar5 = vec4::operator[](pvVar4,1);
  fVar2 = *pfVar5;
  pvVar4 = mat4::operator[](m,0);
  pfVar5 = vec4::operator[](pvVar4,2);
  fVar3 = *pfVar5;
  pvVar4 = mat4::operator[](__return_storage_ptr__,3);
  pfVar5 = vec4::operator[](pvVar4,1);
  *pfVar5 = fVar3 * fVar17 + fVar1 * fVar14 + -(fVar2 * fVar16);
  pvVar4 = mat4::operator[](m,3);
  pfVar5 = vec4::operator[](pvVar4,0);
  fVar1 = *pfVar5;
  pvVar4 = mat4::operator[](m,3);
  pfVar5 = vec4::operator[](pvVar4,1);
  fVar2 = *pfVar5;
  pvVar4 = mat4::operator[](m,3);
  pfVar5 = vec4::operator[](pvVar4,2);
  fVar3 = *pfVar5;
  pvVar4 = mat4::operator[](__return_storage_ptr__,3);
  pfVar5 = vec4::operator[](pvVar4,2);
  *pfVar5 = -fVar3 * fVar6 + -fVar1 * fVar9 + fVar2 * fVar7;
  pvVar4 = mat4::operator[](m,2);
  pfVar5 = vec4::operator[](pvVar4,0);
  fVar1 = *pfVar5;
  pvVar4 = mat4::operator[](m,2);
  pfVar5 = vec4::operator[](pvVar4,1);
  fVar2 = *pfVar5;
  pvVar4 = mat4::operator[](m,2);
  pfVar5 = vec4::operator[](pvVar4,2);
  fVar3 = *pfVar5;
  pvVar4 = mat4::operator[](__return_storage_ptr__,3);
  pfVar5 = vec4::operator[](pvVar4,3);
  *pfVar5 = fVar3 * fVar6 + fVar1 * fVar9 + -(fVar2 * fVar7);
  return __return_storage_ptr__;
}

Assistant:

mat4 adjugate(const mat4& m)
{
    /* based on Laplace expansion theorem */
    const float_t s0 = M00(m) * M11(m) - M10(m) * M01(m);
    const float_t s1 = M00(m) * M12(m) - M10(m) * M02(m);
    const float_t s2 = M00(m) * M13(m) - M10(m) * M03(m);
    const float_t s3 = M01(m) * M12(m) - M11(m) * M02(m);
    const float_t s4 = M01(m) * M13(m) - M11(m) * M03(m);
    const float_t s5 = M02(m) * M13(m) - M12(m) * M03(m);
    const float_t c5 = M22(m) * M33(m) - M32(m) * M23(m);
    const float_t c4 = M21(m) * M33(m) - M31(m) * M23(m);
    const float_t c3 = M21(m) * M32(m) - M31(m) * M22(m);
    const float_t c2 = M20(m) * M33(m) - M30(m) * M23(m);
    const float_t c1 = M20(m) * M32(m) - M30(m) * M22(m);
    const float_t c0 = M20(m) * M31(m) - M30(m) * M21(m);
    mat4 a;

    M00(a) = M11(m)*c5 - M12(m)*c4 + M13(m)*c3;
    M01(a) =-M01(m)*c5 + M02(m)*c4 - M03(m)*c3;
    M02(a) = M31(m)*s5 - M32(m)*s4 + M33(m)*s3;
    M03(a) =-M21(m)*s5 + M22(m)*s4 - M23(m)*s3;

    M10(a) =-M10(m)*c5 + M12(m)*c2 - M13(m)*c1;
    M11(a) = M00(m)*c5 - M02(m)*c2 + M03(m)*c1;
    M12(a) =-M30(m)*s5 + M32(m)*s2 - M33(m)*s1;
    M13(a) = M20(m)*s5 - M22(m)*s2 + M23(m)*s1;

    M20(a) = M10(m)*c4 - M11(m)*c2 + M13(m)*c0;
    M21(a) =-M00(m)*c4 + M01(m)*c2 - M03(m)*c0;
    M22(a) = M30(m)*s4 - M31(m)*s2 + M33(m)*s0;
    M23(a) =-M20(m)*s4 + M21(m)*s2 - M23(m)*s0;

    M30(a) =-M10(m)*c3 + M11(m)*c1 - M12(m)*c0;
    M31(a) = M00(m)*c3 - M01(m)*c1 + M02(m)*c0;
    M32(a) =-M30(m)*s3 + M31(m)*s1 - M32(m)*s0;
    M33(a) = M20(m)*s3 - M21(m)*s1 + M22(m)*s0;

    return a;
}